

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

void __thiscall helics::apps::Recorder::saveFile(Recorder *this,string *filename)

{
  bool bVar1;
  size_type __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  
  __pos = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          rfind(filename,'.',0xffffffffffffffff);
  if (__pos == 0xffffffffffffffff) {
    ext._M_dataplus._M_p = (pointer)&ext.field_2;
    ext._M_string_length = 0;
    ext.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ext,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filename,__pos,
               0xffffffffffffffff);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ext,
                          ".json");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ext,".JSON");
    if (!bVar1) {
      writeTextFile(this,filename);
      goto LAB_0022a2d9;
    }
  }
  writeJsonFile(this,filename);
LAB_0022a2d9:
  std::__cxx11::string::~string((string *)&ext);
  return;
}

Assistant:

void Recorder::saveFile(const std::string& filename)
{
    auto lastP = filename.find_last_of('.');
    auto ext = (lastP != std::string::npos) ? filename.substr(lastP) : std::string{};
    if ((ext == ".json") || (ext == ".JSON")) {
        writeJsonFile(filename);
    } else {
        writeTextFile(filename);
    }
}